

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivfenc.c
# Opt level: O2

void ivf_write_frame_header(FILE *outfile,int64_t pts,size_t frame_size)

{
  char header [12];
  
  header[0] = (char)frame_size;
  header[1] = (char)(frame_size >> 8);
  header[2] = (char)(frame_size >> 0x10);
  header[3] = (char)(frame_size >> 0x18);
  header[4] = (char)pts;
  header[5] = (char)((ulong)pts >> 8);
  header[6] = (char)((ulong)pts >> 0x10);
  header[7] = (char)((ulong)pts >> 0x18);
  header[8] = (char)((ulong)pts >> 0x20);
  header[9] = (char)((ulong)pts >> 0x28);
  header[10] = (char)((ulong)pts >> 0x30);
  header[0xb] = (char)((ulong)pts >> 0x38);
  fwrite(header,1,0xc,(FILE *)outfile);
  return;
}

Assistant:

void ivf_write_frame_header(FILE *outfile, int64_t pts, size_t frame_size) {
  char header[12];

  mem_put_le32(header, (int)frame_size);
  mem_put_le32(header + 4, (int)(pts & 0xFFFFFFFF));
  mem_put_le32(header + 8, (int)(pts >> 32));
  fwrite(header, 1, 12, outfile);
}